

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O2

void number_suite::outer_int(void)

{
  bool bVar1;
  int iVar2;
  undefined4 local_16c;
  view_type local_168;
  chunk_reader reader;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&reader.super_basic_reader<char>);
  local_168._M_len = 1;
  local_168._M_str = "0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&reader.super_basic_reader<char>,&local_168);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x3f,"void number_suite::outer_int()",!bVar1);
  local_168._M_len =
       CONCAT44(local_168._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_16c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x40,"void number_suite::outer_int()",&local_168,&local_16c);
  local_168._M_len = 1;
  local_168._M_str = "0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::finish(&reader,&local_168);
  boost::detail::test_impl
            ("reader.finish(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x41,"void number_suite::outer_int()",bVar1);
  local_16c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x42,"void number_suite::outer_int()",&local_168,&local_16c);
  iVar2 = trial::protocol::json::basic_reader<char>::overloader<int,_void>::value
                    (&reader.super_basic_reader<char>);
  local_168._M_len = CONCAT44(local_168._M_len._4_4_,iVar2);
  local_16c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x43,"void number_suite::outer_int()",&local_168,&local_16c);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.super_basic_reader<char>.stack);
  return;
}

Assistant:

void outer_int()
{
    // "0" is legal, but we must specify that we reached the input end
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.finish("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 0);
}